

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O1

void __thiscall glu::ObjectVector::clear(ObjectVector *this)

{
  pointer puVar1;
  
  (**(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->deleteFunc))
            ((ulong)((long)(this->m_objects).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->m_objects).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  puVar1 = (this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void ObjectVector::clear (void)
{
	(m_gl.*m_traits.deleteFunc)(glw::GLsizei(m_objects.size()), &m_objects.front());
	m_objects.clear();
}